

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O1

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::addEdge
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,float wt)

{
  size_t *psVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _List_node_base local_48;
  float local_38;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>_>_>
           ::operator[](&this->adj,u);
  pcVar2 = (v->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + v->_M_string_length)
  ;
  local_38 = wt;
  p_Var4 = (_List_node_base *)operator_new(0x38);
  p_Var4[1]._M_next = p_Var4 + 2;
  if (local_58 == &local_48) {
    p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
    p_Var4[2]._M_prev = local_48._M_prev;
  }
  else {
    p_Var4[1]._M_next = local_58;
    p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
  }
  p_Var4[1]._M_prev = local_50;
  local_50 = (_List_node_base *)0x0;
  local_48._M_next._0_1_ = 0;
  *(float *)&p_Var4[3]._M_next = local_38;
  local_58 = &local_48;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pmVar3->
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_) + 1);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>_>_>
           ::operator[](&this->adj,v);
  pcVar2 = (u->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + u->_M_string_length)
  ;
  local_38 = wt;
  p_Var4 = (_List_node_base *)operator_new(0x38);
  p_Var4[1]._M_next = p_Var4 + 2;
  if (local_58 == &local_48) {
    p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
    p_Var4[2]._M_prev = local_48._M_prev;
  }
  else {
    p_Var4[1]._M_next = local_58;
    p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
  }
  p_Var4[1]._M_prev = local_50;
  local_50 = (_List_node_base *)0x0;
  local_48._M_next._0_1_ = 0;
  *(float *)&p_Var4[3]._M_next = local_38;
  local_58 = &local_48;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pmVar3->
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_) + 1);
  }
  return;
}

Assistant:

void addEdge(ver u, ver v, float wt) {
      adj[u].push_back({v, wt});
      adj[v].push_back({u, wt});
    }